

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O0

void __thiscall DropdownMenu::addMenuButton(DropdownMenu *this,TextButton *menuButton)

{
  float fVar1;
  Vector2f *pVVar2;
  size_type sVar3;
  reference pvVar4;
  long in_RSI;
  long in_RDI;
  int i;
  Vector2f newBackgroundSize;
  undefined4 in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  RectangleShape *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  float fVar5;
  vector<TextButton,_std::allocator<TextButton>_> *in_stack_ffffffffffffff80;
  Vector2<float> local_3c;
  Vector2<float> local_34;
  int local_2c;
  Vector2<float> local_28;
  Vector2<float> local_20;
  Vector2<float> local_18;
  long local_10;
  
  local_10 = in_RSI;
  std::vector<TextButton,_std::allocator<TextButton>_>::push_back
            (in_stack_ffffffffffffff80,
             (value_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  std::vector<TextButton,_std::allocator<TextButton>_>::back
            ((vector<TextButton,_std::allocator<TextButton>_> *)in_stack_ffffffffffffff70);
  sf::Transformable::getPosition((Transformable *)(in_RDI + 0x470));
  pVVar2 = sf::RectangleShape::getSize((RectangleShape *)(in_RDI + 0x468));
  sf::Vector2<float>::Vector2(&local_20,2.0,pVVar2->y - 2.0);
  local_18 = sf::operator+((Vector2<float> *)
                           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                           (Vector2<float> *)0x1a819d);
  sf::Transformable::setPosition
            ((Transformable *)in_stack_ffffffffffffff70,
             (Vector2f *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  pVVar2 = sf::RectangleShape::getSize((RectangleShape *)(in_RDI + 0x468));
  fVar5 = pVVar2->x;
  pVVar2 = sf::RectangleShape::getSize((RectangleShape *)(in_RDI + 0x468));
  fVar1 = pVVar2->y;
  pVVar2 = sf::RectangleShape::getSize((RectangleShape *)(local_10 + 0x228));
  sf::Vector2<float>::Vector2(&local_28,fVar5,fVar1 + pVVar2->y);
  fVar5 = local_28.x;
  pVVar2 = sf::RectangleShape::getSize((RectangleShape *)(local_10 + 0x228));
  if (pVVar2->x + 4.0 <= fVar5) {
    pVVar2 = sf::RectangleShape::getSize((RectangleShape *)(local_10 + 0x228));
    if (pVVar2->x < *(float *)(in_RDI + 0x5d8)) {
      pvVar4 = std::vector<TextButton,_std::allocator<TextButton>_>::back
                         ((vector<TextButton,_std::allocator<TextButton>_> *)
                          in_stack_ffffffffffffff70);
      in_stack_ffffffffffffff70 = &pvVar4->button;
      in_stack_ffffffffffffff6c = *(float *)(in_RDI + 0x5d8);
      pVVar2 = sf::RectangleShape::getSize((RectangleShape *)(local_10 + 0x228));
      sf::Vector2<float>::Vector2(&local_3c,in_stack_ffffffffffffff6c,pVVar2->y);
      sf::RectangleShape::setSize
                (in_stack_ffffffffffffff70,
                 (Vector2f *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
  }
  else {
    pVVar2 = sf::RectangleShape::getSize((RectangleShape *)(local_10 + 0x228));
    local_28.x = pVVar2->x + 4.0;
    pVVar2 = sf::RectangleShape::getSize((RectangleShape *)(local_10 + 0x228));
    *(float *)(in_RDI + 0x5d8) = pVVar2->x;
    sVar3 = std::vector<TextButton,_std::allocator<TextButton>_>::size
                      ((vector<TextButton,_std::allocator<TextButton>_> *)(in_RDI + 0x5c0));
    for (local_2c = (int)sVar3 + -2; -1 < local_2c; local_2c = local_2c + -1) {
      std::vector<TextButton,_std::allocator<TextButton>_>::operator[]
                ((vector<TextButton,_std::allocator<TextButton>_> *)(in_RDI + 0x5c0),(long)local_2c)
      ;
      fVar5 = *(float *)(in_RDI + 0x5d8);
      pvVar4 = std::vector<TextButton,_std::allocator<TextButton>_>::operator[]
                         ((vector<TextButton,_std::allocator<TextButton>_> *)(in_RDI + 0x5c0),
                          (long)local_2c);
      pVVar2 = sf::RectangleShape::getSize(&pvVar4->button);
      sf::Vector2<float>::Vector2(&local_34,fVar5,pVVar2->y);
      sf::RectangleShape::setSize
                (in_stack_ffffffffffffff70,
                 (Vector2f *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
  }
  sf::RectangleShape::setSize
            (in_stack_ffffffffffffff70,
             (Vector2f *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  return;
}

Assistant:

void DropdownMenu::addMenuButton(const TextButton& menuButton) {
    menuButtons.push_back(menuButton);
    menuButtons.back().setPosition(background.getPosition() + Vector2f(2.0f, background.getSize().y - 2.0f));
    Vector2f newBackgroundSize(background.getSize().x, background.getSize().y + menuButton.button.getSize().y);
    if (newBackgroundSize.x < menuButton.button.getSize().x + 4.0f) {
        newBackgroundSize.x = menuButton.button.getSize().x + 4.0f;
        maxMenuButtonWidth = menuButton.button.getSize().x;
        for (int i = menuButtons.size() - 2; i >= 0; --i) {
            menuButtons[i].button.setSize(Vector2f(maxMenuButtonWidth, menuButtons[i].button.getSize().y));
        }
    } else if (menuButton.button.getSize().x < maxMenuButtonWidth) {
        menuButtons.back().button.setSize(Vector2f(maxMenuButtonWidth, menuButton.button.getSize().y));
    }
    background.setSize(newBackgroundSize);
}